

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOV.c
# Opt level: O0

GLsizei fill_text_data(GLfloat *data,GLubyte *string,GLsizei len)

{
  byte bVar1;
  double_t dVar2;
  double_t dVar3;
  double ry;
  double rx;
  GLfloat t1;
  GLfloat t0;
  GLfloat s1;
  GLfloat s0;
  texture_glyph_t *glyph;
  GLsizei i;
  GLsizei num;
  double h;
  double w;
  double y;
  double x;
  double pen_y;
  double pen_x;
  GLubyte *pGStack_18;
  GLsizei len_local;
  GLubyte *string_local;
  GLfloat *data_local;
  
  pen_y = 0.5;
  x = 0.5;
  glyph._4_4_ = 0;
  glyph._0_4_ = 0;
  pen_x._4_4_ = len;
  pGStack_18 = string;
  string_local = (GLubyte *)data;
  do {
    if (pen_x._4_4_ <= (int)glyph) {
      return glyph._4_4_;
    }
    bVar1 = pGStack_18[(int)glyph];
    _s1 = font.glyphs + bVar1;
    switch(_s1->codepoint) {
    case 9:
      pen_y = (double)((float)((int)(pen_y / 64.0 + 2.0) / 2 << 1) * 64.0);
      break;
    case 0xc:
      x = 0.0;
    case 10:
    case 0xd:
      pen_y = 0.0;
    case 7:
    case 8:
    case 0xb:
    case 0x20:
      break;
    default:
      y = (pen_y + (double)font.glyphs[bVar1].offset_x) / 64.0;
      w = (x + (double)font.glyphs[bVar1].offset_y) / 64.0;
      t0 = font.glyphs[bVar1].s0;
      t1 = font.glyphs[bVar1].s1;
      rx._4_4_ = font.glyphs[bVar1].t0;
      rx._0_4_ = font.glyphs[bVar1].t1;
      dVar2 = getMiddlePixelTex(&t0,&t1,640.0);
      dVar3 = getMiddlePixelTex((GLfloat *)((long)&rx + 4),(GLfloat *)&rx,640.0);
      h = ((double)_s1->width * dVar2) / 64.0;
      _i = ((double)_s1->height * dVar3) / 64.0;
      *(float *)(string_local + (long)(glyph._4_4_ * 0x18) * 4) = (float)y;
      *(float *)(string_local + (long)(glyph._4_4_ * 0x18 + 1) * 4) = (float)w;
      *(GLfloat *)(string_local + (long)(glyph._4_4_ * 0x18 + 2) * 4) = t0;
      *(float *)(string_local + (long)(glyph._4_4_ * 0x18 + 3) * 4) = rx._4_4_;
      *(float *)(string_local + (long)(glyph._4_4_ * 0x18 + 4) * 4) = (float)y;
      *(float *)(string_local + (long)(glyph._4_4_ * 0x18 + 5) * 4) = (float)(w - _i);
      *(GLfloat *)(string_local + (long)(glyph._4_4_ * 0x18 + 6) * 4) = t0;
      *(float *)(string_local + (long)(glyph._4_4_ * 0x18 + 7) * 4) = rx._0_4_;
      *(float *)(string_local + (long)(glyph._4_4_ * 0x18 + 8) * 4) = (float)(y + h);
      *(float *)(string_local + (long)(glyph._4_4_ * 0x18 + 9) * 4) = (float)(w - _i);
      *(GLfloat *)(string_local + (long)(glyph._4_4_ * 0x18 + 10) * 4) = t1;
      *(float *)(string_local + (long)(glyph._4_4_ * 0x18 + 0xb) * 4) = rx._0_4_;
      *(float *)(string_local + (long)(glyph._4_4_ * 0x18 + 0xc) * 4) = (float)y;
      *(float *)(string_local + (long)(glyph._4_4_ * 0x18 + 0xd) * 4) = (float)w;
      *(GLfloat *)(string_local + (long)(glyph._4_4_ * 0x18 + 0xe) * 4) = t0;
      *(float *)(string_local + (long)(glyph._4_4_ * 0x18 + 0xf) * 4) = rx._4_4_;
      *(float *)(string_local + (long)(glyph._4_4_ * 0x18 + 0x10) * 4) = (float)(y + h);
      *(float *)(string_local + (long)(glyph._4_4_ * 0x18 + 0x11) * 4) = (float)(w - _i);
      *(GLfloat *)(string_local + (long)(glyph._4_4_ * 0x18 + 0x12) * 4) = t1;
      *(float *)(string_local + (long)(glyph._4_4_ * 0x18 + 0x13) * 4) = rx._0_4_;
      *(float *)(string_local + (long)(glyph._4_4_ * 0x18 + 0x14) * 4) = (float)(y + h);
      *(float *)(string_local + (long)(glyph._4_4_ * 0x18 + 0x15) * 4) = (float)w;
      *(GLfloat *)(string_local + (long)(glyph._4_4_ * 0x18 + 0x16) * 4) = t1;
      *(float *)(string_local + (long)(glyph._4_4_ * 0x18 + 0x17) * 4) = rx._4_4_;
      glyph._4_4_ = glyph._4_4_ + 1;
    }
    pen_y = (double)_s1->advance_x + pen_y;
    x = (double)_s1->advance_y + x;
    glyph._0_4_ = (int)glyph + 1;
  } while( true );
}

Assistant:

static GLsizei fill_text_data(GLfloat* data,
                              const GLubyte* string,
                              GLsizei len)
{
	double pen_x = 0.5; // position in pixel
	double pen_y = 0.5;
	double x,y,w,h;

	GLsizei num = 0;
	for(GLsizei i=0; i<len; i++) {
		const texture_glyph_t *glyph = font.glyphs + string[i];

		switch(glyph->codepoint) {
			// up, semi-up, semi-down...  x01 - 06, e1 - e6, c0 -df, f0 - ff  could mean something
			case '\f':  // back to the beginning
				pen_y = 0;
				/* FALLTHRU */
			case '\n':  // newline
			case '\r':  // carriage return
				pen_x = 0;
				/* FALLTHRU */
			case ' ':   // space
			case '\a':  // goes up :-)
			case '\v':  // vertical space
			case '\b':  // back the size of a space
				break;
			case '\t':  // tab
				pen_x = ((int) (pen_x/font.size + 2) / 2) * 2 * font.size;
				break;
			default:
				x = (pen_x + glyph->offset_x)/font.size;
				y = (pen_y + glyph->offset_y)/font.size;

				GLfloat s0 = glyph->s0, s1 = glyph->s1;
				GLfloat t0 = glyph->t0, t1 = glyph->t1;

				double rx = getMiddlePixelTex(&s0, &s1, font.tex_width);
				double ry = getMiddlePixelTex(&t0, &t1, font.tex_height);

				w = glyph->width*rx/font.size;
				h = glyph->height*ry/font.size;

				data[24*num + 0] = (GLfloat) x;
				data[24*num + 1] = (GLfloat) y;
				data[24*num + 2] = s0;
				data[24*num + 3] = t0;
				data[24*num + 4] = (GLfloat) x;
				data[24*num + 5] = (GLfloat) (y - h);
				data[24*num + 6] = s0;
				data[24*num + 7] = t1;
				data[24*num + 8] = (GLfloat) (x + w);
				data[24*num + 9] = (GLfloat) (y - h);
				data[24*num + 10] = s1;
				data[24*num + 11] = t1;
				data[24*num + 12] = (GLfloat) x;
				data[24*num + 13] = (GLfloat) y;
				data[24*num + 14] = s0;
				data[24*num + 15] = t0;
				data[24*num + 16] = (GLfloat) (x + w);
				data[24*num + 17] = (GLfloat) (y - h);
				data[24*num + 18] = s1;
				data[24*num + 19] = t1;
				data[24*num + 20] = (GLfloat) (x + w);
				data[24*num + 21] = (GLfloat) y;
				data[24*num + 22] = s1;
				data[24*num + 23] = t0;

				num++;
				break;

		}
		pen_x += glyph->advance_x;
		pen_y += glyph->advance_y;
	}

	return num;
}